

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ezexample_predict_threaded.cc
# Opt level: O0

void __thiscall Worker::operator()(Worker *this)

{
  vw *pvVar1;
  ostream *poVar2;
  reference pdVar3;
  ezexample *peVar4;
  void *this_00;
  long in_RDI;
  float fVar5;
  ezexample ex;
  iterator it;
  int i;
  int errorCount;
  ostream *in_stack_fffffffffffffce8;
  ezexample *in_stack_fffffffffffffcf0;
  undefined4 in_stack_fffffffffffffd28;
  float in_stack_fffffffffffffd2c;
  ezexample *in_stack_fffffffffffffd30;
  undefined1 multiline;
  vw *in_stack_fffffffffffffd38;
  ezexample *in_stack_fffffffffffffd40;
  trace_message_t in_stack_fffffffffffffd48;
  char ns;
  ezexample *in_stack_fffffffffffffd50;
  io_buf *in_stack_fffffffffffffd58;
  double dVar6;
  undefined4 in_stack_fffffffffffffd60;
  undefined4 in_stack_fffffffffffffd64;
  allocator local_239;
  string local_238 [39];
  allocator<char> local_211;
  string local_210 [38];
  vw_namespace local_1ea;
  allocator local_1e9;
  string local_1e8 [38];
  vw_namespace local_1c2;
  vw_namespace local_1c1 [32];
  bool in_stack_fffffffffffffe5f;
  vw *in_stack_fffffffffffffe60;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_48;
  int local_3c;
  int local_38;
  string local_28 [40];
  
  std::__cxx11::string::string(local_28,*(string **)(in_RDI + 0x18));
  pvVar1 = VW::initialize((string *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                          in_stack_fffffffffffffd58,
                          SUB81((ulong)in_stack_fffffffffffffd50 >> 0x38,0),
                          in_stack_fffffffffffffd48,in_stack_fffffffffffffd40);
  *(vw **)(in_RDI + 8) = pvVar1;
  std::__cxx11::string::~string(local_28);
  if (*(long *)(in_RDI + 8) != 0) {
    local_38 = 0;
    for (local_3c = 0; multiline = (undefined1)((ulong)in_stack_fffffffffffffd30 >> 0x38),
        local_3c < runcount; local_3c = local_3c + 1) {
      local_48._M_current =
           (double *)
           std::vector<double,_std::allocator<double>_>::begin
                     ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffce8);
      ezexample::ezexample
                (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,(bool)multiline,
                 (vw *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
      vw_namespace::vw_namespace(local_1c1,'s');
      ezexample::operator()(in_stack_fffffffffffffcf0,(vw_namespace *)in_stack_fffffffffffffce8);
      ezexample::operator()(in_stack_fffffffffffffd40,(char *)in_stack_fffffffffffffd38);
      ezexample::operator()(in_stack_fffffffffffffd40,(char *)in_stack_fffffffffffffd38);
      ezexample::operator()(in_stack_fffffffffffffd40,(char *)in_stack_fffffffffffffd38);
      vw_namespace::vw_namespace(&local_1c2,'t');
      ezexample::operator()(in_stack_fffffffffffffcf0,(vw_namespace *)in_stack_fffffffffffffce8);
      ezexample::operator()(in_stack_fffffffffffffd40,(char *)in_stack_fffffffffffffd38);
      ezexample::operator()(in_stack_fffffffffffffd40,(char *)in_stack_fffffffffffffd38);
      ezexample::operator()(in_stack_fffffffffffffd40,(char *)in_stack_fffffffffffffd38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1e8,"1",&local_1e9);
      ezexample::set_label(in_stack_fffffffffffffd40,(string *)in_stack_fffffffffffffd38);
      std::__cxx11::string::~string(local_1e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
      pdVar3 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
               ::operator*(&local_48);
      dVar6 = *pdVar3;
      fVar5 = ezexample::operator()((ezexample *)0x11d149);
      if ((dVar6 != (double)fVar5) || (NAN(dVar6) || NAN((double)fVar5))) {
        in_stack_fffffffffffffd50 = (ezexample *)std::operator<<((ostream *)&std::cerr,"fail!");
        std::ostream::operator<<(in_stack_fffffffffffffd50,std::endl<char,std::char_traits<char>>);
        local_38 = local_38 + 1;
      }
      __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
      operator++(&local_48);
      ezexample::operator--(in_stack_fffffffffffffcf0);
      vw_namespace::vw_namespace(&local_1ea,'t');
      peVar4 = ezexample::operator()
                         (in_stack_fffffffffffffcf0,(vw_namespace *)in_stack_fffffffffffffce8);
      ns = (char)((ulong)peVar4 >> 0x38);
      in_stack_fffffffffffffd40 =
           ezexample::operator()(in_stack_fffffffffffffd40,(char *)in_stack_fffffffffffffd38);
      in_stack_fffffffffffffd38 =
           (vw *)ezexample::operator()(in_stack_fffffffffffffd40,(char *)in_stack_fffffffffffffd38);
      ezexample::operator()(in_stack_fffffffffffffd40,(char *)in_stack_fffffffffffffd38);
      in_stack_fffffffffffffd30 = (ezexample *)&local_211;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_210,"1",(allocator *)in_stack_fffffffffffffd30);
      ezexample::set_label(in_stack_fffffffffffffd40,(string *)in_stack_fffffffffffffd38);
      std::__cxx11::string::~string(local_210);
      std::allocator<char>::~allocator(&local_211);
      pdVar3 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
               ::operator*(&local_48);
      dVar6 = *pdVar3;
      in_stack_fffffffffffffd2c = ezexample::operator()((ezexample *)0x11d321);
      if ((dVar6 != (double)in_stack_fffffffffffffd2c) ||
         (NAN(dVar6) || NAN((double)in_stack_fffffffffffffd2c))) {
        poVar2 = std::operator<<((ostream *)&std::cerr,"fail!");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        local_38 = local_38 + 1;
      }
      __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
      operator++(&local_48);
      ezexample::operator--(in_stack_fffffffffffffcf0);
      ezexample::operator()(in_stack_fffffffffffffd50,ns,(char *)in_stack_fffffffffffffd40);
      ezexample::operator()(in_stack_fffffffffffffd50,ns,(char *)in_stack_fffffffffffffd40);
      ezexample::operator()(in_stack_fffffffffffffd50,ns,(char *)in_stack_fffffffffffffd40);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_238,"1",&local_239);
      ezexample::set_label(in_stack_fffffffffffffd40,(string *)in_stack_fffffffffffffd38);
      std::__cxx11::string::~string(local_238);
      std::allocator<char>::~allocator((allocator<char> *)&local_239);
      pdVar3 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
               ::operator*(&local_48);
      in_stack_fffffffffffffcf0 = (ezexample *)*pdVar3;
      fVar5 = ezexample::operator()((ezexample *)0x11d4c2);
      if (((double)in_stack_fffffffffffffcf0 != (double)fVar5) ||
         (NAN((double)in_stack_fffffffffffffcf0) || NAN((double)fVar5))) {
        in_stack_fffffffffffffce8 = std::operator<<((ostream *)&std::cerr,"fail!");
        std::ostream::operator<<(in_stack_fffffffffffffce8,std::endl<char,std::char_traits<char>>);
        local_38 = local_38 + 1;
      }
      __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
      operator++(&local_48);
      ezexample::~ezexample(in_stack_fffffffffffffd30);
    }
    poVar2 = std::operator<<((ostream *)&std::cerr,"error count = ");
    this_00 = (void *)std::ostream::operator<<(poVar2,local_38);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    VW::finish(in_stack_fffffffffffffe60,in_stack_fffffffffffffe5f);
    *(undefined8 *)(in_RDI + 8) = 0;
    return;
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,"cannot initialize vw parser");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  exit(-1);
}

Assistant:

void operator()()
  { m_vw_parser = VW::initialize(vw_init_string);
    if (m_vw_parser == NULL)
    { cerr << "cannot initialize vw parser" << endl;
      exit(-1);
    }

    int errorCount = 0;
    for (int i = 0; i < runcount; ++i)
    { vector<double>::iterator it = m_referenceValues.begin();
      ezexample ex(&m_vw, false, m_vw_parser);

      ex(vw_namespace('s'))
      ("p^the_man")
      ("w^the")
      ("w^man")
      (vw_namespace('t'))
      ("p^le_homme")
      ("w^le")
      ("w^homme");
      ex.set_label("1");
      if (*it != ex()) { cerr << "fail!" << endl; ++errorCount; }
      //if (*it != pred) { cerr << "fail!" << endl; ++errorCount; }
      //VW::finish_example(m_vw, vec2);
      ++it;

      --ex;   // remove the most recent namespace
      ex(vw_namespace('t'))
      ("p^un_homme")
      ("w^un")
      ("w^homme");
      ex.set_label("1");
      if (*it != ex()) { cerr << "fail!" << endl; ++errorCount; }
      ++it;

      --ex;   // remove the most recent namespace
      // add features with explicit ns
      ex('t', "p^un_homme")
      ('t', "w^un")
      ('t', "w^homme");
      ex.set_label("1");
      if (*it != ex()) { cerr << "fail!" << endl; ++errorCount; }
      ++it;

      //cout << "."; cout.flush();
    }
    cerr << "error count = " << errorCount << endl;
    VW::finish(*m_vw_parser);
    m_vw_parser = NULL;
  }